

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::Rc<kj::Refcounted>,_kj::Canceler::AdapterImpl<kj::Rc<kj::Refcounted>_>_>::
reject(AdapterPromiseNode<kj::Rc<kj::Refcounted>,_kj::Canceler::AdapterImpl<kj::Rc<kj::Refcounted>_>_>
       *this,Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<kj::Rc<kj::Refcounted>_> local_1c8;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<kj::Rc<kj::Refcounted>,_kj::Canceler::AdapterImpl<kj::Rc<kj::Refcounted>_>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<kj::Rc<kj::Refcounted>_>::ExceptionOr(&local_1c8,false,exception_00);
    ExceptionOr<kj::Rc<kj::Refcounted>_>::operator=(&this->result,&local_1c8);
    ExceptionOr<kj::Rc<kj::Refcounted>_>::~ExceptionOr(&local_1c8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }